

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::parseCurrencyOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  int32_t iVar1;
  undefined8 uVar2;
  UErrorCode localStatus;
  CurrencyUnit currency;
  UErrorCode local_7c;
  ConstChar16Ptr local_78;
  char16_t *local_70;
  UnicodeString local_60;
  
  iVar1 = numparse::impl::StringSegment::length(segment);
  if (iVar1 == 3) {
    numparse::impl::StringSegment::toTempUnicodeString(&local_60,segment);
    if ((local_60.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
      uVar2 = local_60.fUnion.fFields.fArray;
      if ((local_60.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        uVar2 = (char16_t *)((long)&local_60.fUnion + 2);
      }
    }
    else {
      uVar2 = (char16_t *)0x0;
    }
    UnicodeString::~UnicodeString(&local_60);
    local_7c = U_ZERO_ERROR;
    local_78.p_ = (char16_t *)uVar2;
    CurrencyUnit::CurrencyUnit((CurrencyUnit *)&local_60,&local_78,&local_7c);
    local_70 = local_78.p_;
    if (local_7c < U_ILLEGAL_ARGUMENT_ERROR) {
      MeasureUnit::operator=(&macros->unit,(MeasureUnit *)&local_60);
    }
    else {
      *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
    }
    CurrencyUnit::~CurrencyUnit((CurrencyUnit *)&local_60);
  }
  else {
    *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  return;
}

Assistant:

void blueprint_helpers::parseCurrencyOption(const StringSegment& segment, MacroProps& macros,
                                            UErrorCode& status) {
    // Unlike ICU4J, have to check length manually because ICU4C CurrencyUnit does not check it for us
    if (segment.length() != 3) {
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    const UChar* currencyCode = segment.toTempUnicodeString().getBuffer();
    UErrorCode localStatus = U_ZERO_ERROR;
    CurrencyUnit currency(currencyCode, localStatus);
    if (U_FAILURE(localStatus)) {
        // Not 3 ascii chars
        // throw new SkeletonSyntaxException("Invalid currency", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Slicing is OK
    macros.unit = currency; // NOLINT
}